

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpInit_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  int iVar1;
  SUNLogger pSVar2;
  void *pvVar3;
  ARKodeMem in_RSI;
  long in_RDI;
  ARKodeMem in_XMM0_Qa;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  int local_4;
  
  if (*(int *)((long)&in_RSI->sunctx->profiler + 4) < *(int *)&in_RSI->sunctx->profiler) {
    if (in_RSI->sunctx->logger != (SUNLogger)0x0) {
      free(in_RSI->sunctx->logger);
      in_RSI->sunctx->logger = (SUNLogger)0x0;
    }
    if (*(long *)&in_RSI->sunctx->own_profiler != 0) {
      for (in_stack_ffffffffffffffdc = 0;
          in_stack_ffffffffffffffdc < *(int *)&in_RSI->sunctx->profiler;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        if (*(long *)(*(long *)&in_RSI->sunctx->own_profiler + (long)in_stack_ffffffffffffffdc * 8)
            != 0) {
          arkFreeVec(in_XMM0_Qa,
                     (N_Vector *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          *(undefined8 *)
           (*(long *)&in_RSI->sunctx->own_profiler + (long)in_stack_ffffffffffffffdc * 8) = 0;
        }
      }
      free(*(void **)&in_RSI->sunctx->own_profiler);
      *(undefined8 *)&in_RSI->sunctx->own_profiler = 0;
    }
  }
  if (in_RSI->sunctx->logger == (SUNLogger)0x0) {
    pSVar2 = (SUNLogger)malloc((long)*(int *)&in_RSI->sunctx->profiler << 3);
    in_RSI->sunctx->logger = pSVar2;
    if (in_RSI->sunctx->logger == (SUNLogger)0x0) {
      arkInterpFree(in_XMM0_Qa,
                    (ARKInterp)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      return -0x14;
    }
  }
  if (*(long *)&in_RSI->sunctx->own_profiler == 0) {
    pvVar3 = malloc((long)*(int *)&in_RSI->sunctx->profiler << 3);
    *(void **)&in_RSI->sunctx->own_profiler = pvVar3;
    if (*(long *)&in_RSI->sunctx->own_profiler == 0) {
      arkInterpFree(in_XMM0_Qa,
                    (ARKInterp)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      return -0x14;
    }
    for (iVar4 = 0; iVar4 < *(int *)&in_RSI->sunctx->profiler; iVar4 = iVar4 + 1) {
      *(undefined8 *)(*(long *)&in_RSI->sunctx->own_profiler + (long)iVar4 * 8) = 0;
      iVar1 = arkAllocVec(in_RSI,(N_Vector)in_XMM0_Qa,
                          (N_Vector *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
      if (iVar1 == 0) {
        arkInterpFree(in_XMM0_Qa,(ARKInterp)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
        return -0x14;
      }
    }
  }
  if (*(int *)((long)&in_RSI->sunctx->profiler + 4) < *(int *)&in_RSI->sunctx->profiler) {
    *(undefined4 *)((long)&in_RSI->sunctx->profiler + 4) = *(undefined4 *)&in_RSI->sunctx->profiler;
  }
  for (iVar4 = 0; iVar4 < *(int *)((long)&in_RSI->sunctx->profiler + 4); iVar4 = iVar4 + 1) {
    *(undefined8 *)(&in_RSI->sunctx->logger->comm + (long)iVar4 * 2) = 0;
  }
  iVar4 = N_VConstVectorArray(0,*(undefined4 *)((long)&in_RSI->sunctx->profiler + 4),
                              *(undefined8 *)&in_RSI->sunctx->own_profiler);
  if (iVar4 == 0) {
    *(ARKodeMem *)in_RSI->sunctx->logger = in_XMM0_Qa;
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x230),
             **(undefined8 **)&in_RSI->sunctx->own_profiler);
    in_RSI->sunctx->own_logger = 1;
    local_4 = 0;
  }
  else {
    local_4 = -0x1c;
  }
  return local_4;
}

Assistant:

int arkInterpInit_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
  {
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAX(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL)
  {
    LINT_THIST(I) = (sunrealtype*)malloc(LINT_NMAX(I) * sizeof(sunrealtype));
    if (LINT_THIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL)
  {
    LINT_YHIST(I) = (N_Vector*)malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL)
    {
      arkInterpFree(ark_mem, I);
      return (ARK_MEM_FAIL);
    }
    for (i = 0; i < LINT_NMAX(I); i++)
    {
      LINT_YJ(I, i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I, i))))
      {
        arkInterpFree(ark_mem, I);
        return (ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necessary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) { LINT_NMAXALLOC(I) = LINT_NMAX(I); }

  /* zero out history (to be safe) */
  for (i = 0; i < LINT_NMAXALLOC(I); i++) { LINT_TJ(I, i) = SUN_RCONST(0.0); }
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), SUN_RCONST(0.0), LINT_YHIST(I)))
  {
    return (ARK_VECTOROP_ERR);
  }

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I, 0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I, 0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return (ARK_SUCCESS);
}